

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::WatWriter::FlushExprTree(WatWriter *this,ExprTree *expr_tree)

{
  bool bVar1;
  ExprType EVar2;
  BlockExprBase<(wabt::ExprType)7> *pBVar3;
  BlockExprBase<(wabt::ExprType)22> *pBVar4;
  IfExpr *pIVar5;
  IfExceptExpr *expr;
  TryExpr *pTVar6;
  char *pcVar7;
  TryExpr *try_expr;
  IfExceptExpr *if_except_expr;
  IfExpr *if_expr;
  ExprTree *expr_tree_local;
  WatWriter *this_local;
  
  EVar2 = Expr::type(expr_tree->expr);
  switch(EVar2) {
  case Block:
    WritePuts(this,"(",None);
    pBVar3 = cast<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Expr>(expr_tree->expr);
    pcVar7 = Opcode::GetName((Opcode *)&Opcode::Block_Opcode);
    WriteBeginBlock(this,Block,&pBVar3->block,pcVar7);
    pBVar3 = cast<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Expr>(expr_tree->expr);
    WriteFoldedExprList(this,&(pBVar3->block).exprs);
    FlushExprTreeStack(this);
    WriteCloseNewline(this);
    break;
  default:
    WritePuts(this,"(",None);
    WriteExpr(this,expr_tree->expr);
    Indent(this);
    FlushExprTreeVector(this,&expr_tree->children);
    WriteCloseNewline(this);
    break;
  case If:
    pIVar5 = cast<wabt::IfExpr,wabt::Expr>(expr_tree->expr);
    WritePuts(this,"(",None);
    pcVar7 = Opcode::GetName((Opcode *)&Opcode::If_Opcode);
    WriteBeginBlock(this,If,&pIVar5->true_,pcVar7);
    FlushExprTreeVector(this,&expr_tree->children);
    WriteOpenNewline(this,"then");
    WriteFoldedExprList(this,&(pIVar5->true_).exprs);
    FlushExprTreeStack(this);
    WriteCloseNewline(this);
    bVar1 = intrusive_list<wabt::Expr>::empty(&pIVar5->false_);
    if (!bVar1) {
      WriteOpenNewline(this,"else");
      WriteFoldedExprList(this,&pIVar5->false_);
      FlushExprTreeStack(this);
      WriteCloseNewline(this);
    }
    WriteCloseNewline(this);
    break;
  case IfExcept:
    expr = cast<wabt::IfExceptExpr,wabt::Expr>(expr_tree->expr);
    WritePuts(this,"(",None);
    WriteBeginIfExceptBlock(this,expr);
    FlushExprTreeVector(this,&expr_tree->children);
    WriteOpenNewline(this,"then");
    WriteFoldedExprList(this,&(expr->true_).exprs);
    FlushExprTreeStack(this);
    WriteCloseNewline(this);
    bVar1 = intrusive_list<wabt::Expr>::empty(&expr->false_);
    if (!bVar1) {
      WriteOpenNewline(this,"else");
      WriteFoldedExprList(this,&expr->false_);
      FlushExprTreeStack(this);
      WriteCloseNewline(this);
    }
    WriteCloseNewline(this);
    break;
  case Loop:
    WritePuts(this,"(",None);
    pBVar4 = cast<wabt::BlockExprBase<(wabt::ExprType)22>,wabt::Expr>(expr_tree->expr);
    pcVar7 = Opcode::GetName((Opcode *)&Opcode::Loop_Opcode);
    WriteBeginBlock(this,Loop,&pBVar4->block,pcVar7);
    pBVar4 = cast<wabt::BlockExprBase<(wabt::ExprType)22>,wabt::Expr>(expr_tree->expr);
    WriteFoldedExprList(this,&(pBVar4->block).exprs);
    FlushExprTreeStack(this);
    WriteCloseNewline(this);
    break;
  case Try:
    pTVar6 = cast<wabt::TryExpr,wabt::Expr>(expr_tree->expr);
    WritePuts(this,"(",None);
    pcVar7 = Opcode::GetName((Opcode *)&Opcode::Try_Opcode);
    WriteBeginBlock(this,Try,&pTVar6->block,pcVar7);
    FlushExprTreeVector(this,&expr_tree->children);
    WriteFoldedExprList(this,&(pTVar6->block).exprs);
    FlushExprTreeStack(this);
    WriteOpenNewline(this,"catch");
    WriteFoldedExprList(this,&pTVar6->catch_);
    FlushExprTreeStack(this);
    WriteCloseNewline(this);
    WriteCloseNewline(this);
  }
  return;
}

Assistant:

void WatWriter::FlushExprTree(const ExprTree& expr_tree) {
  WABT_TRACE_ARGS(FlushExprTree, "%s", GetExprTypeName(*expr_tree.expr));
  switch (expr_tree.expr->type()) {
    case ExprType::Block:
      WritePuts("(", NextChar::None);
      WriteBeginBlock(LabelType::Block, cast<BlockExpr>(expr_tree.expr)->block,
                      Opcode::Block_Opcode.GetName());
      WriteFoldedExprList(cast<BlockExpr>(expr_tree.expr)->block.exprs);
      FlushExprTreeStack();
      WriteCloseNewline();
      break;

    case ExprType::Loop:
      WritePuts("(", NextChar::None);
      WriteBeginBlock(LabelType::Loop, cast<LoopExpr>(expr_tree.expr)->block,
                      Opcode::Loop_Opcode.GetName());
      WriteFoldedExprList(cast<LoopExpr>(expr_tree.expr)->block.exprs);
      FlushExprTreeStack();
      WriteCloseNewline();
      break;

    case ExprType::If: {
      auto if_expr = cast<IfExpr>(expr_tree.expr);
      WritePuts("(", NextChar::None);
      WriteBeginBlock(LabelType::If, if_expr->true_,
                      Opcode::If_Opcode.GetName());
      FlushExprTreeVector(expr_tree.children);
      WriteOpenNewline("then");
      WriteFoldedExprList(if_expr->true_.exprs);
      FlushExprTreeStack();
      WriteCloseNewline();
      if (!if_expr->false_.empty()) {
        WriteOpenNewline("else");
        WriteFoldedExprList(if_expr->false_);
        FlushExprTreeStack();
        WriteCloseNewline();
      }
      WriteCloseNewline();
      break;
    }

    case ExprType::IfExcept: {
      auto if_except_expr = cast<IfExceptExpr>(expr_tree.expr);
      WritePuts("(", NextChar::None);
      WriteBeginIfExceptBlock(if_except_expr);
      FlushExprTreeVector(expr_tree.children);
      WriteOpenNewline("then");
      WriteFoldedExprList(if_except_expr->true_.exprs);
      FlushExprTreeStack();
      WriteCloseNewline();
      if (!if_except_expr->false_.empty()) {
        WriteOpenNewline("else");
        WriteFoldedExprList(if_except_expr->false_);
        FlushExprTreeStack();
        WriteCloseNewline();
      }
      WriteCloseNewline();
      break;
    }

    case ExprType::Try: {
      auto try_expr = cast<TryExpr>(expr_tree.expr);
      WritePuts("(", NextChar::None);
      WriteBeginBlock(LabelType::Try, try_expr->block,
                      Opcode::Try_Opcode.GetName());
      FlushExprTreeVector(expr_tree.children);
      WriteFoldedExprList(try_expr->block.exprs);
      FlushExprTreeStack();
      WriteOpenNewline("catch");
      WriteFoldedExprList(try_expr->catch_);
      FlushExprTreeStack();
      WriteCloseNewline();
      WriteCloseNewline();
      break;
    }

    default: {
      WritePuts("(", NextChar::None);
      WriteExpr(expr_tree.expr);
      Indent();
      FlushExprTreeVector(expr_tree.children);
      WriteCloseNewline();
      break;
    }
  }
}